

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O3

int lws_ssl_client_bio_create(lws *wsi)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  SSL *ssl;
  undefined8 uVar4;
  BIO *rbio;
  lws_system_blob_t *plVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  uint8_t *data;
  char hostname [128];
  uint8_t openssl_alpn [40];
  uchar *local_d0;
  char local_c8 [128];
  uint8_t local_48 [40];
  
  if (wsi->stash == (client_info_stash *)0x0) {
    pcVar7 = (wsi->context->tls).alpn_default;
    iVar2 = lws_hdr_copy(wsi,local_c8,0x80,_WSI_TOKEN_CLIENT_HOST);
    if (iVar2 < 1) {
      _lws_log(1,"%s: Unable to get hostname\n","lws_ssl_client_bio_create");
      return -1;
    }
  }
  else {
    lws_strncpy(local_c8,wsi->stash->cis[2],0x80);
    pcVar7 = wsi->stash->cis[7];
  }
  for (pcVar3 = local_c8; *pcVar3 != '\0'; pcVar3 = pcVar3 + 1) {
    if (*pcVar3 == ':') {
      *pcVar3 = '\0';
      break;
    }
  }
  ssl = SSL_new((SSL_CTX *)(wsi->vhost->tls).ssl_client_ctx);
  (wsi->tls).ssl = (lws_tls_conn *)ssl;
  if (ssl == (SSL *)0x0) {
    iVar2 = lws_ssl_get_error(wsi,0);
    pcVar7 = ERR_error_string((long)iVar2,(char *)0x0);
    _lws_log(1,"SSL_new failed: %s\n",pcVar7);
    lws_tls_err_describe_clear();
    return -1;
  }
  if ((wsi->vhost->tls).ssl_info_event_mask != 0) {
    SSL_set_info_callback(ssl,lws_ssl_info_callback);
  }
  if (((wsi->tls).use_ssl & 4) == 0) {
    uVar4 = SSL_get0_param((wsi->tls).ssl);
    X509_VERIFY_PARAM_set_hostflags(uVar4,4);
    iVar2 = X509_VERIFY_PARAM_set1_ip_asc(uVar4,local_c8);
    if (iVar2 == 0) {
      X509_VERIFY_PARAM_set1_host(uVar4,local_c8,0);
    }
  }
  SSL_set_verify((SSL *)(wsi->tls).ssl,1,OpenSSL_client_verify_callback);
  SSL_ctrl((SSL *)(wsi->tls).ssl,0x21,2,(void *)0x0);
  SSL_ctrl((SSL *)(wsi->tls).ssl,0x37,0,local_c8);
  rbio = BIO_new_socket((wsi->desc).sockfd,0);
  (wsi->tls).client_bio = (lws_tls_bio *)rbio;
  SSL_set_bio((SSL *)(wsi->tls).ssl,rbio,rbio);
  BIO_ctrl((BIO *)(wsi->tls).client_bio,0x66,1,(void *)0x0);
  pcVar3 = (wsi->vhost->tls).alpn;
  if (pcVar3 != (char *)0x0) {
    pcVar7 = pcVar3;
  }
  if (wsi->stash != (client_info_stash *)0x0) {
    pcVar7 = wsi->stash->cis[7];
  }
  iVar2 = lws_hdr_copy(wsi,local_c8,0x80,_WSI_TOKEN_CLIENT_ALPN);
  if (0 < iVar2) {
    pcVar7 = local_c8;
  }
  _lws_log(8,"%s client conn using alpn list \'%s\'\n",wsi->role_ops->name,pcVar7);
  iVar2 = lws_alpn_comma_to_openssl(pcVar7,local_48,0x27);
  SSL_set_alpn_protos((wsi->tls).ssl,local_48,iVar2);
  SSL_set_ex_data((SSL *)(wsi->tls).ssl,openssl_websocket_private_data_index,wsi);
  if (wsi->sys_tls_client_cert == 0) {
    return 0;
  }
  plVar5 = lws_system_get_blob(wsi->context,LWS_SYSBLOB_TYPE_CLIENT_CERT_DER,
                               wsi->sys_tls_client_cert - 1);
  if (((plVar5 != (lws_system_blob_t *)0x0) &&
      (sVar6 = lws_system_blob_get_size(plVar5), sVar6 != 0)) &&
     (iVar2 = lws_system_blob_get_single_ptr(plVar5,&local_d0), iVar2 == 0)) {
    iVar2 = SSL_use_certificate_ASN1((SSL *)(wsi->tls).ssl,local_d0,(int)sVar6);
    if (iVar2 == 1) {
      plVar5 = lws_system_get_blob(wsi->context,LWS_SYSBLOB_TYPE_CLIENT_KEY_DER,
                                   wsi->sys_tls_client_cert - 1);
      if (((plVar5 == (lws_system_blob_t *)0x0) ||
          (sVar6 = lws_system_blob_get_size(plVar5), sVar6 == 0)) ||
         (iVar2 = lws_system_blob_get_single_ptr(plVar5,&local_d0), iVar2 != 0)) goto LAB_0012a298;
      iVar2 = SSL_use_PrivateKey_ASN1(6,(SSL *)(wsi->tls).ssl,local_d0,(long)(int)sVar6);
      if ((iVar2 == 1) ||
         (iVar2 = SSL_use_PrivateKey_ASN1(0x198,(SSL *)(wsi->tls).ssl,local_d0,(long)(int)sVar6),
         iVar2 == 1)) {
        iVar2 = SSL_check_private_key((SSL *)(wsi->tls).ssl);
        if (iVar2 != 1) {
          _lws_log(1,"Private SSL key doesn\'t match cert\n");
          lws_tls_err_describe_clear();
          return 1;
        }
        bVar1 = wsi->sys_tls_client_cert;
        pcVar7 = "%s: set system client cert %u\n";
        iVar8 = 0;
        iVar2 = 4;
        goto LAB_0012a2ba;
      }
      pcVar7 = "%s: use_privkey failed\n";
    }
    else {
      pcVar7 = "%s: use_certificate failed\n";
    }
    _lws_log(1,pcVar7,"lws_ssl_client_bio_create");
    lws_tls_err_describe_clear();
  }
LAB_0012a298:
  bVar1 = wsi->sys_tls_client_cert;
  pcVar7 = "%s: unable to set up system client cert %d\n";
  iVar8 = 1;
  iVar2 = 1;
LAB_0012a2ba:
  _lws_log(iVar2,pcVar7,"lws_ssl_client_bio_create",(ulong)(bVar1 - 1));
  return iVar8;
}

Assistant:

int
lws_ssl_client_bio_create(struct lws *wsi)
{
	char hostname[128], *p;
#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
	uint8_t openssl_alpn[40];
	const char *alpn_comma = wsi->context->tls.alpn_default;
	int n;
#endif

	if (wsi->stash) {
		lws_strncpy(hostname, wsi->stash->cis[CIS_HOST], sizeof(hostname));
#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
		alpn_comma = wsi->stash->cis[CIS_ALPN];
#endif
	} else {
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		if (lws_hdr_copy(wsi, hostname, sizeof(hostname),
				 _WSI_TOKEN_CLIENT_HOST) <= 0)
#endif
		{
			lwsl_err("%s: Unable to get hostname\n", __func__);

			return -1;
		}
	}

	/*
	 * remove any :port part on the hostname... necessary for network
	 * connection but typical certificates do not contain it
	 */
	p = hostname;
	while (*p) {
		if (*p == ':') {
			*p = '\0';
			break;
		}
		p++;
	}

	wsi->tls.ssl = SSL_new(wsi->vhost->tls.ssl_client_ctx);
	if (!wsi->tls.ssl) {
		lwsl_err("SSL_new failed: %s\n",
		         ERR_error_string(lws_ssl_get_error(wsi, 0), NULL));
		lws_tls_err_describe_clear();
		return -1;
	}

#if defined (LWS_HAVE_SSL_SET_INFO_CALLBACK)
	if (wsi->vhost->tls.ssl_info_event_mask)
		SSL_set_info_callback(wsi->tls.ssl, lws_ssl_info_callback);
#endif

#if defined LWS_HAVE_X509_VERIFY_PARAM_set1_host
	if (!(wsi->tls.use_ssl & LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK)) {
		X509_VERIFY_PARAM *param = SSL_get0_param(wsi->tls.ssl);

		/* Enable automatic hostname checks */
		X509_VERIFY_PARAM_set_hostflags(param,
					X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS);
		// Handle the case where the hostname is an IP address.
		if (!X509_VERIFY_PARAM_set1_ip_asc(param, hostname))
			X509_VERIFY_PARAM_set1_host(param, hostname, 0);
	}
#else
	if (!(wsi->tls.use_ssl & LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK)) {
		lwsl_err("%s: your tls lib is too old to have "
			 "X509_VERIFY_PARAM_set1_host, failing all client tls\n",
			 __func__);
		return -1;
	}
#endif

#if !defined(USE_WOLFSSL)
#ifndef USE_OLD_CYASSL
	/* OpenSSL_client_verify_callback will be called @ SSL_connect() */
	SSL_set_verify(wsi->tls.ssl, SSL_VERIFY_PEER,
		       OpenSSL_client_verify_callback);
#endif
#endif

#if !defined(USE_WOLFSSL)
	SSL_set_mode(wsi->tls.ssl,  SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER);
#endif
	/*
	 * use server name indication (SNI), if supported,
	 * when establishing connection
	 */
#ifdef USE_WOLFSSL
#ifdef USE_OLD_CYASSL
#ifdef CYASSL_SNI_HOST_NAME
	CyaSSL_UseSNI(wsi->tls.ssl, CYASSL_SNI_HOST_NAME, hostname,
		      strlen(hostname));
#endif
#else
#ifdef WOLFSSL_SNI_HOST_NAME
	wolfSSL_UseSNI(wsi->tls.ssl, WOLFSSL_SNI_HOST_NAME, hostname,
		       strlen(hostname));
#endif
#endif
#else
#ifdef SSL_CTRL_SET_TLSEXT_HOSTNAME
	SSL_set_tlsext_host_name(wsi->tls.ssl, hostname);
#endif
#endif

#ifdef USE_WOLFSSL
	/*
	 * wolfSSL/CyaSSL does certificate verification differently
	 * from OpenSSL.
	 * If we should ignore the certificate, we need to set
	 * this before SSL_new and SSL_connect is called.
	 * Otherwise the connect will simply fail with error code -155
	 */
#ifdef USE_OLD_CYASSL
	if (wsi->tls.use_ssl == 2)
		CyaSSL_set_verify(wsi->tls.ssl, SSL_VERIFY_NONE, NULL);
#else
	if (wsi->tls.use_ssl == 2)
		wolfSSL_set_verify(wsi->tls.ssl, SSL_VERIFY_NONE, NULL);
#endif
#endif /* USE_WOLFSSL */

	wsi->tls.client_bio = BIO_new_socket((int)(long long)wsi->desc.sockfd,
					     BIO_NOCLOSE);
	SSL_set_bio(wsi->tls.ssl, wsi->tls.client_bio, wsi->tls.client_bio);

#ifdef USE_WOLFSSL
#ifdef USE_OLD_CYASSL
	CyaSSL_set_using_nonblock(wsi->tls.ssl, 1);
#else
	wolfSSL_set_using_nonblock(wsi->tls.ssl, 1);
#endif
#else
	BIO_set_nbio(wsi->tls.client_bio, 1); /* nonblocking */
#endif

#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
	if (wsi->vhost->tls.alpn)
		alpn_comma = wsi->vhost->tls.alpn;
	if (wsi->stash)
		alpn_comma = wsi->stash->cis[CIS_ALPN];
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	if (lws_hdr_copy(wsi, hostname, sizeof(hostname),
			 _WSI_TOKEN_CLIENT_ALPN) > 0)
		alpn_comma = hostname;
#endif

	lwsl_info("%s client conn using alpn list '%s'\n", wsi->role_ops->name, alpn_comma);

	n = lws_alpn_comma_to_openssl(alpn_comma, openssl_alpn,
				      sizeof(openssl_alpn) - 1);

	SSL_set_alpn_protos(wsi->tls.ssl, openssl_alpn, n);
#endif

	SSL_set_ex_data(wsi->tls.ssl, openssl_websocket_private_data_index,
			wsi);

	if (wsi->sys_tls_client_cert) {
		lws_system_blob_t *b = lws_system_get_blob(wsi->context,
					LWS_SYSBLOB_TYPE_CLIENT_CERT_DER,
					wsi->sys_tls_client_cert - 1);
		const uint8_t *data;
		size_t size;

		if (!b)
			goto no_client_cert;

		/*
		 * Set up the per-connection client cert
		 */

		size = lws_system_blob_get_size(b);
		if (!size)
			goto no_client_cert;

		if (lws_system_blob_get_single_ptr(b, &data))
			goto no_client_cert;

		if (SSL_use_certificate_ASN1(wsi->tls.ssl, data, (int)size) != 1) {
			lwsl_err("%s: use_certificate failed\n", __func__);
			lws_tls_err_describe_clear();
			goto no_client_cert;
		}

		b = lws_system_get_blob(wsi->context,
					LWS_SYSBLOB_TYPE_CLIENT_KEY_DER,
					wsi->sys_tls_client_cert - 1);
		if (!b)
			goto no_client_cert;

		size = lws_system_blob_get_size(b);
		if (!size)
			goto no_client_cert;

		if (lws_system_blob_get_single_ptr(b, &data))
			goto no_client_cert;

		if (SSL_use_PrivateKey_ASN1(EVP_PKEY_RSA, wsi->tls.ssl,
					    data, (int)size) != 1 &&
		    SSL_use_PrivateKey_ASN1(EVP_PKEY_EC, wsi->tls.ssl,
					    data, (int)size) != 1) {
			lwsl_err("%s: use_privkey failed\n", __func__);
			lws_tls_err_describe_clear();
			goto no_client_cert;
		}

		if (SSL_check_private_key(wsi->tls.ssl) != 1) {
			lwsl_err("Private SSL key doesn't match cert\n");
			lws_tls_err_describe_clear();
			return 1;
		}

		lwsl_notice("%s: set system client cert %u\n", __func__,
				wsi->sys_tls_client_cert - 1);
	}

	return 0;

no_client_cert:
	lwsl_err("%s: unable to set up system client cert %d\n", __func__,
			wsi->sys_tls_client_cert - 1);

	return 1;
}